

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

Arg * __thiscall
fmt::BasicFormatter<char>::parse_arg_name
          (Arg *__return_storage_ptr__,BasicFormatter<char> *this,char **s)

{
  byte bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  undefined4 uVar5;
  const_iterator cVar6;
  FormatError *this_00;
  byte *pbVar7;
  char *message;
  key_type local_30;
  
  local_30.data_ = *s;
  if ((*local_30.data_ != 0x5f) && (0x19 < (byte)((*local_30.data_ & 0xdfU) + 0xbf))) {
    __assert_fail("is_name_start(*s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.cc"
                  ,0x36f,
                  "Arg fmt::BasicFormatter<char>::parse_arg_name(const Char *&) [Char = char]");
  }
  local_30.size_ = (long)*s - (long)local_30.data_;
  pbVar7 = (byte *)(*s + 1);
  do {
    do {
      *s = (char *)pbVar7;
      bVar1 = *pbVar7;
      local_30.size_ = local_30.size_ + 1;
      pbVar7 = pbVar7 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
  } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  if ((this->super_FormatterBase).next_arg_index_ < 1) {
    (this->super_FormatterBase).next_arg_index_ = -1;
    message = (char *)0x0;
    internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)this);
    cVar6 = std::
            _Rb_tree<fmt::BasicStringRef<char>,_std::pair<const_fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::_Select1st<std::pair<const_fmt::BasicStringRef<char>,_fmt::internal::Arg>_>,_std::less<fmt::BasicStringRef<char>_>,_std::allocator<std::pair<const_fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
            ::find((_Rb_tree<fmt::BasicStringRef<char>,_std::pair<const_fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::_Select1st<std::pair<const_fmt::BasicStringRef<char>,_fmt::internal::Arg>_>,_std::less<fmt::BasicStringRef<char>_>,_std::allocator<std::pair<const_fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
                    *)&this->map_,&local_30);
    if ((_Rb_tree_header *)cVar6._M_node != &(this->map_).map_._M_t._M_impl.super__Rb_tree_header) {
      p_Var2 = cVar6._M_node[1]._M_left;
      p_Var3 = cVar6._M_node[1]._M_right;
      uVar5 = *(undefined4 *)&cVar6._M_node[2].field_0x4;
      p_Var4 = cVar6._M_node[2]._M_parent;
      __return_storage_ptr__->type = cVar6._M_node[2]._M_color;
      *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar5;
      *(_Base_ptr *)&__return_storage_ptr__->field_0x18 = p_Var4;
      (__return_storage_ptr__->super_Value).field_0.long_long_value = (LongLong)p_Var2;
      (__return_storage_ptr__->super_Value).field_0.string.size = (size_t)p_Var3;
      goto LAB_001c181a;
    }
    message = "argument not found";
  }
  else {
    message = "cannot switch from automatic to manual argument indexing";
  }
  *(undefined8 *)&__return_storage_ptr__->type = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
  (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
  (__return_storage_ptr__->super_Value).field_0.string.size = 0;
LAB_001c181a:
  if (message != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this_00,(CStringRef)message);
    __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Arg fmt::BasicFormatter<Char>::parse_arg_name(const Char *&s) {
  assert(is_name_start(*s));
  const Char *start = s;
  Char c;
  do {
    c = *++s;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  const char *error = 0;
  Arg arg = get_arg(fmt::BasicStringRef<Char>(start, s - start), error);
  if (error)
    FMT_THROW(fmt::FormatError(error));
  return arg;
}